

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O3

void radio_draw_config(t_radio *x,_glist *glist)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  _glist *p_Var7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint local_14c;
  ulong local_140;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  t_atom fontatoms [3];
  char tag [128];
  
  p_Var7 = (x->x_gui).x_glist;
  uVar1 = p_Var7->gl_zoom;
  p_Var7 = glist_getcanvas(p_Var7);
  uVar2 = text_xpix((t_text *)x,glist);
  uVar3 = text_ypix((t_text *)x,glist);
  fontatoms[0].a_type = A_SYMBOL;
  fontatoms[0].a_w.w_symbol = gensym((x->x_gui).x_font);
  fontatoms[1].a_type = A_FLOAT;
  fontatoms[1].a_w._0_4_ = (undefined4)(int)-((x->x_gui).x_fontsize * uVar1);
  fontatoms[2].a_type = A_SYMBOL;
  fontatoms[2].a_w.w_symbol = gensym(sys_fontweight);
  if (x->x_orientation == horizontal) {
    iVar12 = (x->x_gui).x_w;
    iVar10 = 0;
    iVar9 = iVar12;
  }
  else {
    iVar10 = (x->x_gui).x_h;
    iVar12 = iVar10;
    iVar9 = 0;
  }
  if (0 < x->x_number) {
    iVar4 = iVar12 + 3;
    if (-1 < iVar12) {
      iVar4 = iVar12;
    }
    uVar14 = iVar12 + uVar3;
    iVar4 = iVar4 >> 2;
    uVar15 = uVar14 - iVar4;
    uVar16 = iVar4 + uVar3;
    uVar13 = iVar12 + uVar2;
    uVar17 = uVar13 - iVar4;
    uVar5 = iVar4 + uVar2;
    uVar6 = x->x_on;
    uVar18 = 0;
    local_14c = uVar2;
    uVar11 = uVar3;
    do {
      local_108 = (ulong)uVar5;
      local_110 = (ulong)uVar15;
      local_118 = (ulong)uVar16;
      local_120 = (ulong)uVar17;
      local_140 = (ulong)uVar14;
      uVar8 = (ulong)(uint)(&(x->x_gui).x_fcol)[uVar18 != uVar6];
      sprintf(tag,"%lxBASE%d",x,(ulong)uVar18);
      pdgui_vmess((char *)0x0,"crs iiii",p_Var7,"coords",tag,(ulong)local_14c,(ulong)uVar11,
                  (ulong)uVar13,local_140);
      pdgui_vmess((char *)0x0,"crs ri rk",p_Var7,"itemconfigure",tag,"-width",(ulong)uVar1,"-fill",
                  (ulong)(uint)(x->x_gui).x_bcol);
      sprintf(tag,"%lxBUT%d",x,(ulong)uVar18);
      pdgui_vmess((char *)0x0,"crs iiii",p_Var7,"coords",tag,local_108,local_118,local_120,local_110
                 );
      pdgui_vmess((char *)0x0,"crs rk rk",p_Var7,"itemconfigure",tag,"-fill",uVar8,"-outline",uVar8)
      ;
      local_14c = local_14c + iVar9;
      uVar13 = uVar13 + iVar9;
      uVar5 = uVar5 + iVar9;
      uVar17 = uVar17 + iVar9;
      uVar11 = uVar11 + iVar10;
      uVar14 = uVar14 + iVar10;
      uVar16 = uVar16 + iVar10;
      uVar15 = uVar15 + iVar10;
      uVar6 = x->x_on;
      x->x_drawn = uVar6;
      uVar18 = uVar18 + 1;
    } while ((int)uVar18 < x->x_number);
  }
  sprintf(tag,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs ii",p_Var7,"coords",tag,(ulong)((x->x_gui).x_ldx * uVar1 + uVar2),
              (ulong)(uVar1 * (x->x_gui).x_ldy + uVar3));
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var7,"itemconfigure",tag,"-font",3,fontatoms,"-fill",
              (ulong)(uint)(x->x_gui).x_lcol);
  iemgui_dolabel(x,&x->x_gui,(x->x_gui).x_lab,1);
  return;
}

Assistant:

static void radio_draw_config(t_radio* x, t_glist* glist)
{
    int i;
    const int zoom = IEMGUI_ZOOM(x);
    t_iemgui *iemgui = &x->x_gui;
    t_canvas *canvas = glist_getcanvas(glist);
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    int xx11b = text_xpix(&x->x_gui.x_obj, glist);
    int yy11b = text_ypix(&x->x_gui.x_obj, glist);
    int d, dx = 0, dy = 0, d4;

    int xx11=xx11b, xx12=0, xx21=0, xx22=0;
    int yy11=yy11b, yy12=0, yy21=0, yy22=0;

    char tag[128];
    t_atom fontatoms[3];
    SETSYMBOL(fontatoms+0, gensym(iemgui->x_font));
    SETFLOAT (fontatoms+1, -iemgui->x_fontsize*zoom);
    SETSYMBOL(fontatoms+2, gensym(sys_fontweight));

    if(x->x_orientation == horizontal)
    {
        d = dx = x->x_gui.x_w;
    } else {
        d = dy = x->x_gui.x_h;
    }
    d4 = d / 4;
    xx12 = xx11 + d;
    xx21 = xx11 + d4;
    xx22 = xx12 - d4;
    yy12 = yy11 + d;
    yy21 = yy11 + d4;
    yy22 = yy12 - d4;

    for(i = 0; i < x->x_number; i++)
    {
        int col = (x->x_on == i) ? x->x_gui.x_fcol : x->x_gui.x_bcol;
        sprintf(tag, "%lxBASE%d", x, i);
        pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
            xx11, yy11, xx12, yy12);
        pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
            "-width", zoom, "-fill", x->x_gui.x_bcol);

        sprintf(tag, "%lxBUT%d", x, i);
        pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
            xx21, yy21, xx22, yy22);
        pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
            "-fill", col, "-outline", col);
        xx11 += dx; xx12 += dx; xx21 += dx; xx22 += dx;
        yy11 += dy; yy12 += dy; yy21 += dy; yy22 += dy;

        x->x_drawn = x->x_on;
    }

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        xx11b + x->x_gui.x_ldx * zoom, yy11b + x->x_gui.x_ldy * zoom);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", x->x_gui.x_lcol);
    iemgui_dolabel(x, &x->x_gui, x->x_gui.x_lab, 1);
}